

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read.c
# Opt level: O1

int archive_read_data_skip(archive *_a)

{
  int iVar1;
  int iVar2;
  int64_t offset;
  size_t size;
  void *buff;
  int64_t iStack_38;
  size_t local_30;
  void *local_28;
  
  iVar1 = __archive_check_magic(_a,0xdeb0c5,4,"archive_read_data_skip");
  iVar2 = -0x1e;
  if (iVar1 != -0x1e) {
    if (*(code **)(_a[0x15].archive_format_name + 0x30) == (code *)0x0) {
      do {
        iVar1 = archive_read_data_block(_a,&local_28,&local_30,&iStack_38);
      } while (iVar1 == 0);
    }
    else {
      iVar1 = (**(code **)(_a[0x15].archive_format_name + 0x30))(_a);
    }
    iVar2 = 0;
    if (iVar1 != 1) {
      iVar2 = iVar1;
    }
    _a->state = 2;
  }
  return iVar2;
}

Assistant:

int
archive_read_data_skip(struct archive *_a)
{
	struct archive_read *a = (struct archive_read *)_a;
	int r;
	const void *buff;
	size_t size;
	int64_t offset;

	archive_check_magic(_a, ARCHIVE_READ_MAGIC, ARCHIVE_STATE_DATA,
	    "archive_read_data_skip");

	if (a->format->read_data_skip != NULL)
		r = (a->format->read_data_skip)(a);
	else {
		while ((r = archive_read_data_block(&a->archive,
			    &buff, &size, &offset))
		    == ARCHIVE_OK)
			;
	}

	if (r == ARCHIVE_EOF)
		r = ARCHIVE_OK;

	a->archive.state = ARCHIVE_STATE_HEADER;
	return (r);
}